

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O0

InplaceStr GetReferenceTypeName(ExpressionContext *ctx,TypeBase *type)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  char *name;
  uint nameLength;
  uint typeNameLength;
  TypeBase *type_local;
  ExpressionContext *ctx_local;
  char *__s;
  
  uVar1 = (int)(type->name).end - (int)(type->name).begin;
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)(uVar1 + 5));
  __s = (char *)CONCAT44(extraout_var,iVar2);
  if (uVar1 != 0) {
    memcpy(__s,(type->name).begin,(ulong)uVar1);
  }
  builtin_strncpy(__s + uVar1," ref",4);
  __s[(ulong)uVar1 + 4] = '\0';
  sVar3 = strlen(__s);
  if (sVar3 + 1 == (ulong)(uVar1 + 5)) {
    InplaceStr::InplaceStr((InplaceStr *)&ctx_local,__s);
    return _ctx_local;
  }
  __assert_fail("strlen(name) + 1 == nameLength",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                ,0x98,"InplaceStr GetReferenceTypeName(ExpressionContext &, TypeBase *)");
}

Assistant:

InplaceStr GetReferenceTypeName(ExpressionContext &ctx, TypeBase* type)
{
	unsigned typeNameLength = unsigned(type->name.end - type->name.begin);

	unsigned nameLength = typeNameLength + 4 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	if(typeNameLength)
		memcpy(name, type->name.begin, typeNameLength);

	memcpy(name + typeNameLength, " ref", 5);

	assert(strlen(name) + 1 == nameLength);
	return InplaceStr(name);
}